

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinB88>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,host_buffer_type eps)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  double rho_a;
  double dVar5;
  double dVar6;
  double sigma_bb;
  double dVar7;
  
  if (0 < N) {
    pdVar3 = sigma + 2;
    lVar2 = 0;
    do {
      dVar5 = *(double *)((long)rho + lVar2 * 2);
      dVar6 = *(double *)((long)rho + lVar2 * 2 + 8);
      if (dVar5 + dVar6 <= 1e-25) {
        *(double *)((long)eps + lVar2) = 0.0;
      }
      else {
        rho_a = 1e-25;
        if (1e-25 <= dVar5) {
          rho_a = dVar5;
        }
        dVar5 = 1e-25;
        if (1e-25 <= dVar6) {
          dVar5 = dVar6;
        }
        dVar6 = 2.1544346900319022e-67;
        if (2.1544346900319022e-67 <= pdVar3[-2]) {
          dVar6 = pdVar3[-2];
        }
        sigma_bb = 2.1544346900319022e-67;
        if (2.1544346900319022e-67 <= *pdVar3) {
          sigma_bb = *pdVar3;
        }
        dVar7 = (sigma_bb + dVar6) * 0.5;
        uVar4 = -(ulong)(-dVar7 <= pdVar3[-1]);
        dVar1 = (double)(uVar4 & (ulong)pdVar3[-1] | ~uVar4 & (ulong)-dVar7);
        uVar4 = -(ulong)(dVar1 <= dVar7);
        kernel_traits<ExchCXX::BuiltinB88>::eval_exc_polar_impl
                  (rho_a,dVar5,dVar6,(double)(~uVar4 & (ulong)dVar7 | uVar4 & (ulong)dVar1),sigma_bb
                   ,(double *)((long)eps + lVar2));
      }
      pdVar3 = pdVar3 + 3;
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

GGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;


    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], eps[i] );

  }

}